

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidobjs.c
# Opt level: O0

void cid_face_done(FT_Face cidface)

{
  FT_Memory memory_00;
  long lVar1;
  CID_Subrs subr;
  FT_UInt n;
  PS_FontInfo info;
  CID_FaceInfo cid;
  FT_Memory memory;
  CID_Face face;
  FT_Face cidface_local;
  
  if (cidface != (FT_Face)0x0) {
    memory_00 = cidface->memory;
    if (cidface[2].bbox.xMin != 0) {
      for (subr._4_4_ = 0; subr._4_4_ < (uint)cidface[2].num_charmaps; subr._4_4_ = subr._4_4_ + 1)
      {
        lVar1 = cidface[2].bbox.xMin + (ulong)subr._4_4_ * 0x10;
        if (*(long *)(lVar1 + 8) != 0) {
          ft_mem_free(memory_00,(void *)**(undefined8 **)(lVar1 + 8));
          **(undefined8 **)(lVar1 + 8) = 0;
          ft_mem_free(memory_00,*(void **)(lVar1 + 8));
          *(undefined8 *)(lVar1 + 8) = 0;
        }
      }
      ft_mem_free(memory_00,(void *)cidface[2].bbox.xMin);
      cidface[2].bbox.xMin = 0;
    }
    ft_mem_free(memory_00,cidface[1].available_sizes);
    cidface[1].available_sizes = (FT_Bitmap_Size *)0x0;
    ft_mem_free(memory_00,*(void **)&cidface[1].num_charmaps);
    *(undefined8 *)&cidface[1].num_charmaps = 0;
    ft_mem_free(memory_00,cidface[1].charmaps);
    cidface[1].charmaps = (FT_CharMap *)0x0;
    ft_mem_free(memory_00,cidface[1].generic.data);
    cidface[1].generic.data = (void *)0x0;
    ft_mem_free(memory_00,cidface[1].generic.finalizer);
    cidface[1].generic.finalizer = (FT_Generic_Finalizer)0x0;
    ft_mem_free(memory_00,cidface[2].charmaps);
    cidface[2].charmaps = (FT_CharMap *)0x0;
    cidface[2].num_charmaps = 0;
    ft_mem_free(memory_00,(void *)cidface[1].face_flags);
    cidface[1].face_flags = 0;
    ft_mem_free(memory_00,cidface[1].family_name);
    cidface[1].family_name = (FT_String *)0x0;
    ft_mem_free(memory_00,cidface[1].style_name);
    cidface[1].style_name = (FT_String *)0x0;
    cidface->family_name = (FT_String *)0x0;
    cidface->style_name = (FT_String *)0x0;
    ft_mem_free(memory_00,(void *)cidface[2].bbox.xMax);
    cidface[2].bbox.xMax = 0;
    ft_mem_free(memory_00,(void *)cidface[2].bbox.yMax);
    cidface[2].bbox.yMax = 0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cid_face_done( FT_Face  cidface )         /* CID_Face */
  {
    CID_Face      face = (CID_Face)cidface;
    FT_Memory     memory;
    CID_FaceInfo  cid;
    PS_FontInfo   info;


    if ( !face )
      return;

    cid    = &face->cid;
    info   = &cid->font_info;
    memory = cidface->memory;

    /* release subrs */
    if ( face->subrs )
    {
      FT_UInt  n;


      for ( n = 0; n < cid->num_dicts; n++ )
      {
        CID_Subrs  subr = face->subrs + n;


        if ( subr->code )
        {
          FT_FREE( subr->code[0] );
          FT_FREE( subr->code );
        }
      }

      FT_FREE( face->subrs );
    }

    /* release FontInfo strings */
    FT_FREE( info->version );
    FT_FREE( info->notice );
    FT_FREE( info->full_name );
    FT_FREE( info->family_name );
    FT_FREE( info->weight );

    /* release font dictionaries */
    FT_FREE( cid->font_dicts );
    cid->num_dicts = 0;

    /* release other strings */
    FT_FREE( cid->cid_font_name );
    FT_FREE( cid->registry );
    FT_FREE( cid->ordering );

    cidface->family_name = NULL;
    cidface->style_name  = NULL;

    FT_FREE( face->binary_data );
    FT_FREE( face->cid_stream );
  }